

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O3

Promise<kj::Maybe<capnp::MessageReaderAndFds>_>
capnp::tryReadMessage
          (AsyncCapabilityStream *input,ArrayPtr<kj::OwnFd> fdSpace,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  PromiseArena *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  void *pvVar4;
  void *pvVar5;
  PromiseArena *pPVar6;
  size_t in_R9;
  TransformPromiseNodeBase *this;
  ArrayPtr<capnp::word> scratchSpace_00;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> reader;
  undefined1 local_58 [24];
  undefined1 local_40 [8];
  void *local_38;
  
  pPVar6 = (PromiseArena *)options.traversalLimitInWords;
  local_58._16_8_ = input;
  kj::heap<capnp::(anonymous_namespace)::AsyncMessageReader,capnp::ReaderOptions&>
            ((ReaderOptions *)local_40);
  pvVar4 = local_38;
  scratchSpace_00.size_ = in_R9;
  scratchSpace_00.ptr = (word *)pPVar6;
  anon_unknown_0::AsyncMessageReader::readWithFds
            ((AsyncMessageReader *)local_58,(AsyncCapabilityStream *)local_38,fdSpace,
             scratchSpace_00);
  uVar2 = local_58._0_8_;
  local_58._8_8_ = local_40;
  local_38 = (void *)0x0;
  pPVar1 = ((PromiseArenaMember *)local_58._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_58._0_8_ - (long)pPVar1) < 0x40) {
    pvVar5 = operator_new(0x400);
    this = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,(OwnPromiseNode *)local_58,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:236:23)>
               ::anon_class_32_2_fe89d4e7_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3c0) = &PTR_destroy_006cb8f8;
    *(undefined8 *)((long)pvVar5 + 0x3e0) = local_58._8_8_;
    *(void **)((long)pvVar5 + 1000) = pvVar4;
    *(_func_int ***)((long)pvVar5 + 0x3f0) = (_func_int **)fdSpace.size_;
    *(PromiseArena **)((long)pvVar5 + 0x3f8) = pPVar6;
    *(void **)((long)pvVar5 + 0x3c8) = pvVar5;
  }
  else {
    ((PromiseArenaMember *)local_58._0_8_)->arena = (PromiseArena *)0x0;
    this = (TransformPromiseNodeBase *)(local_58._0_8_ + -0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,(OwnPromiseNode *)local_58,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:236:23)>
               ::anon_class_32_2_fe89d4e7_for_func::operator());
    ((PromiseArenaMember *)(uVar2 + -0x40))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006cb8f8;
    ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)local_58._8_8_
    ;
    ((PromiseArenaMember *)(uVar2 + -0x20))->arena = (PromiseArena *)pvVar4;
    ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)fdSpace.size_;
    ((PromiseArenaMember *)(uVar2 + -0x10))->arena = pPVar6;
    ((PromiseArenaMember *)(uVar2 + -0x40))->arena = pPVar1;
  }
  uVar3 = local_58._16_8_;
  uVar2 = local_58._0_8_;
  *(TransformPromiseNodeBase **)local_58._16_8_ = this;
  if ((PromiseArenaMember *)local_58._0_8_ != (PromiseArenaMember *)0x0) {
    local_58._0_8_ = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  return (Promise<kj::Maybe<capnp::MessageReaderAndFds>_>)(PromiseNode *)uVar3;
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> tryReadMessage(
    kj::AsyncCapabilityStream& input, kj::ArrayPtr<kj::OwnFd> fdSpace,
    ReaderOptions options, kj::ArrayPtr<word> scratchSpace) {
  auto reader = kj::heap<AsyncMessageReader>(options);
  auto promise = reader->readWithFds(input, fdSpace, scratchSpace);
  return promise.then([reader = kj::mv(reader), fdSpace](kj::Maybe<size_t> nfds) mutable
                      -> kj::Maybe<MessageReaderAndFds> {
    KJ_IF_SOME(n, nfds) {
      return MessageReaderAndFds { kj::mv(reader), fdSpace.first(n) };
    } else {
      return kj::none;
    }
  });
}